

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

int __thiscall basisu::histogram::init(histogram *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  
  vector<unsigned_int>::resize(&this->m_hist,0,false);
  vector<unsigned_int>::resize(&this->m_hist,(ulong)ctx & 0xffffffff,false);
  return extraout_EAX;
}

Assistant:

void init(uint32_t size)
		{
			m_hist.resize(0);
			m_hist.resize(size);
		}